

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void neg_shift_sse4_1(__m128i in0,__m128i in1,__m128i *out0,__m128i *out1,__m128i *clamp_lo,
                     __m128i *clamp_hi,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined8 in_XMM0_Qa;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined8 in_XMM0_Qb;
  int iVar16;
  uint uVar17;
  uint uVar18;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined1 local_1ac;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  __m128i a1;
  __m128i a0;
  __m128i offset;
  int shift_local;
  __m128i *clamp_hi_local;
  __m128i *clamp_lo_local;
  __m128i *out1_local;
  __m128i *out0_local;
  __m128i in1_local;
  __m128i in0_local;
  
  local_1ac = (byte)out0;
  iVar3 = (1 << (local_1ac & 0x1f)) >> 1;
  local_168 = (int)in_XMM0_Qa;
  uStack_164 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_160 = (int)in_XMM0_Qb;
  uStack_15c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_148 = (int)in_XMM1_Qa;
  uStack_144 = (int)((ulong)in_XMM1_Qa >> 0x20);
  uStack_140 = (int)in_XMM1_Qb;
  uStack_13c = (int)((ulong)in_XMM1_Qb >> 0x20);
  in1_local[1] = (ulong)out0 & 0xffffffff;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in1_local[1];
  iVar4 = iVar3 + local_168 >> auVar2;
  iVar8 = iVar3 + uStack_164 >> auVar2;
  iVar12 = iVar3 + uStack_160 >> auVar2;
  iVar16 = iVar3 + uStack_15c >> auVar2;
  clamp_lo_local = (__m128i *)((ulong)out0 & 0xffffffff);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = clamp_lo_local;
  iVar5 = iVar3 - local_148 >> auVar1;
  iVar9 = iVar3 - uStack_144 >> auVar1;
  iVar13 = iVar3 - uStack_140 >> auVar1;
  iVar3 = iVar3 - uStack_13c >> auVar1;
  local_d8 = (int)*(undefined8 *)in1[0];
  uStack_d4 = (int)((ulong)*(undefined8 *)in1[0] >> 0x20);
  uStack_d0 = (int)*(undefined8 *)(in1[0] + 8);
  uStack_cc = (int)((ulong)*(undefined8 *)(in1[0] + 8) >> 0x20);
  uVar6 = (uint)(iVar4 < local_d8) * local_d8 | (uint)(iVar4 >= local_d8) * iVar4;
  uVar10 = (uint)(iVar8 < uStack_d4) * uStack_d4 | (uint)(iVar8 >= uStack_d4) * iVar8;
  uVar14 = (uint)(iVar12 < uStack_d0) * uStack_d0 | (uint)(iVar12 >= uStack_d0) * iVar12;
  uVar17 = (uint)(iVar16 < uStack_cc) * uStack_cc | (uint)(iVar16 >= uStack_cc) * iVar16;
  local_98 = (int)*(undefined8 *)in1[1];
  uStack_94 = (int)((ulong)*(undefined8 *)in1[1] >> 0x20);
  uStack_90 = (int)*(undefined8 *)(in1[1] + 8);
  uStack_8c = (int)((ulong)*(undefined8 *)(in1[1] + 8) >> 0x20);
  local_f8 = (int)*(undefined8 *)in1[0];
  uStack_f4 = (int)((ulong)*(undefined8 *)in1[0] >> 0x20);
  uStack_f0 = (int)*(undefined8 *)(in1[0] + 8);
  uStack_ec = (int)((ulong)*(undefined8 *)(in1[0] + 8) >> 0x20);
  uVar7 = (uint)(iVar5 < local_f8) * local_f8 | (uint)(iVar5 >= local_f8) * iVar5;
  uVar11 = (uint)(iVar9 < uStack_f4) * uStack_f4 | (uint)(iVar9 >= uStack_f4) * iVar9;
  uVar15 = (uint)(iVar13 < uStack_f0) * uStack_f0 | (uint)(iVar13 >= uStack_f0) * iVar13;
  uVar18 = (uint)(iVar3 < uStack_ec) * uStack_ec | (uint)(iVar3 >= uStack_ec) * iVar3;
  local_b8 = (int)*(undefined8 *)in1[1];
  uStack_b4 = (int)((ulong)*(undefined8 *)in1[1] >> 0x20);
  uStack_b0 = (int)*(undefined8 *)(in1[1] + 8);
  uStack_ac = (int)((ulong)*(undefined8 *)(in1[1] + 8) >> 0x20);
  *(ulong *)in0[0] =
       CONCAT44((uint)(uStack_94 < (int)uVar10) * uStack_94 | (uStack_94 >= (int)uVar10) * uVar10,
                (uint)(local_98 < (int)uVar6) * local_98 | (local_98 >= (int)uVar6) * uVar6);
  *(ulong *)(in0[0] + 8) =
       CONCAT44((uint)(uStack_8c < (int)uVar17) * uStack_8c | (uStack_8c >= (int)uVar17) * uVar17,
                (uint)(uStack_90 < (int)uVar14) * uStack_90 | (uStack_90 >= (int)uVar14) * uVar14);
  *(ulong *)in0[1] =
       CONCAT44((uint)(uStack_b4 < (int)uVar11) * uStack_b4 | (uStack_b4 >= (int)uVar11) * uVar11,
                (uint)(local_b8 < (int)uVar7) * local_b8 | (local_b8 >= (int)uVar7) * uVar7);
  *(ulong *)(in0[1] + 8) =
       CONCAT44((uint)(uStack_ac < (int)uVar18) * uStack_ac | (uStack_ac >= (int)uVar18) * uVar18,
                (uint)(uStack_b0 < (int)uVar15) * uStack_b0 | (uStack_b0 >= (int)uVar15) * uVar15);
  return;
}

Assistant:

static void neg_shift_sse4_1(const __m128i in0, const __m128i in1,
                             __m128i *out0, __m128i *out1,
                             const __m128i *clamp_lo, const __m128i *clamp_hi,
                             int shift) {
  __m128i offset = _mm_set1_epi32((1 << shift) >> 1);
  __m128i a0 = _mm_add_epi32(offset, in0);
  __m128i a1 = _mm_sub_epi32(offset, in1);

  a0 = _mm_sra_epi32(a0, _mm_cvtsi32_si128(shift));
  a1 = _mm_sra_epi32(a1, _mm_cvtsi32_si128(shift));

  a0 = _mm_max_epi32(a0, *clamp_lo);
  a0 = _mm_min_epi32(a0, *clamp_hi);
  a1 = _mm_max_epi32(a1, *clamp_lo);
  a1 = _mm_min_epi32(a1, *clamp_hi);

  *out0 = a0;
  *out1 = a1;
}